

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::messageLoop(RpcConnectionState *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  PromiseBase PVar3;
  undefined4 uVar4;
  long *plVar5;
  undefined4 uVar6;
  int iVar7;
  TransformPromiseNodeBase *pTVar8;
  undefined4 extraout_var;
  Disposer *pDVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ChainPromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *pPVar10;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_02;
  _func_int **in_RSI;
  PromiseNode *pPVar11;
  Own<kj::_::ChainPromiseNode> OVar12;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar13;
  Own<kj::_::PromiseNode> local_78;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined8 uStack_60;
  Own<kj::_::PromiseNode> local_58;
  Own<kj::_::PromiseNode> local_40;
  
  if (*(int *)(in_RSI + 9) == 1) {
    if (in_RSI[0x144] < in_RSI[0x145]) {
      kj::newPromiseAndFulfiller<void>();
      p_Var1 = in_RSI[0x146];
      p_Var2 = in_RSI[0x147];
      uVar4 = (undefined4)uStack_60;
      uVar6 = uStack_60._4_4_;
      uStack_60 = (long *)0x0;
      *(undefined4 *)(in_RSI + 0x146) = local_68;
      *(undefined4 *)((long)in_RSI + 0xa34) = uStack_64;
      *(undefined4 *)(in_RSI + 0x147) = uVar4;
      *(undefined4 *)((long)in_RSI + 0xa3c) = uVar6;
      if (p_Var2 != (_func_int *)0x0) {
        (*(code *)**(undefined8 **)p_Var1)(p_Var1,p_Var2 + *(long *)(*(long *)p_Var2 + -0x10));
      }
      pTVar8 = (TransformPromiseNodeBase *)operator_new(0x30);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar8,&local_78,
                 kj::_::
                 TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2081:31),_kj::_::PropagateException>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      (pTVar8->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006201a8;
      pTVar8[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
      local_40.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,capnp::_::(anonymous_namespace)::RpcConnectionState::messageLoop()::{lambda()#1},kj::_::PropagateException>>
            ::instance;
      local_40.ptr = (PromiseNode *)pTVar8;
      OVar12 = kj::heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>
                         ((kj *)&local_58,&local_40);
      pPVar11 = local_40.ptr;
      *(undefined4 *)&(this->super_ErrorHandler)._vptr_ErrorHandler = local_58.disposer._0_4_;
      *(undefined4 *)((long)&(this->super_ErrorHandler)._vptr_ErrorHandler + 4) =
           local_58.disposer._4_4_;
      *(undefined4 *)&(this->super_Refcounted).super_Disposer._vptr_Disposer = local_58.ptr._0_4_;
      *(undefined4 *)((long)&(this->super_Refcounted).super_Disposer._vptr_Disposer + 4) =
           local_58.ptr._4_4_;
      if ((TransformPromiseNodeBase *)local_40.ptr != (TransformPromiseNodeBase *)0x0) {
        local_40.ptr = (PromiseNode *)0x0;
        iVar7 = (**(local_40.disposer)->_vptr_Disposer)
                          (local_40.disposer,
                           ((PromiseNode *)&pPVar11->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                           (long)&((PromiseNode *)&pPVar11->_vptr_PromiseNode)->_vptr_PromiseNode);
        OVar12.disposer._4_4_ = extraout_var;
        OVar12.disposer._0_4_ = iVar7;
        OVar12.ptr = extraout_RDX;
      }
      plVar5 = uStack_60;
      if (uStack_60 != (long *)0x0) {
        uStack_60 = (long *)0x0;
        OVar12 = (Own<kj::_::ChainPromiseNode>)
                 (*(code *)**(undefined8 **)CONCAT44(uStack_64,local_68))
                           ((undefined8 *)CONCAT44(uStack_64,local_68),
                            (long)plVar5 + *(long *)(*plVar5 + -0x10));
      }
      pPVar11 = local_78.ptr;
      if (local_78.ptr == (PromiseNode *)0x0) {
        return (Promise<void>)OVar12;
      }
      local_78.ptr = (PromiseNode *)0x0;
      pDVar9 = local_78.disposer;
    }
    else {
      (**(code **)(*(long *)in_RSI[0xb] + 8))(&local_58);
      pTVar8 = (TransformPromiseNodeBase *)operator_new(0x30);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar8,&local_58,
                 kj::_::
                 TransformPromiseNode<bool,_kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2087:9),_kj::_::PropagateException>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      (pTVar8->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00620230;
      pTVar8[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
      local_78.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<bool,kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>,capnp::_::(anonymous_namespace)::RpcConnectionState::messageLoop()::{lambda(kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>&&)#1},kj::_::PropagateException>>
            ::instance;
      local_78.ptr = (PromiseNode *)pTVar8;
      pTVar8 = (TransformPromiseNodeBase *)operator_new(0x30);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar8,&local_78,
                 kj::_::
                 TransformPromiseNode<kj::_::Void,_bool,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2095:13),_kj::_::PropagateException>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      pPVar11 = local_78.ptr;
      (pTVar8->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00621d20;
      pTVar8[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
      pDVar9 = (Disposer *)
               &kj::_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,bool,capnp::_::(anonymous_namespace)::RpcConnectionState::messageLoop()::{lambda(bool)#1},kj::_::PropagateException>>
                ::instance;
      (this->super_ErrorHandler)._vptr_ErrorHandler =
           (_func_int **)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,bool,capnp::_::(anonymous_namespace)::RpcConnectionState::messageLoop()::{lambda(bool)#1},kj::_::PropagateException>>
            ::instance;
      (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)pTVar8;
      pPVar10 = extraout_RDX_00;
      if ((TransformPromiseNodeBase *)local_78.ptr != (TransformPromiseNodeBase *)0x0) {
        local_78.ptr = (PromiseNode *)0x0;
        iVar7 = (**(local_78.disposer)->_vptr_Disposer)
                          (local_78.disposer,
                           ((PromiseNode *)&pPVar11->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                           (long)&((PromiseNode *)&pPVar11->_vptr_PromiseNode)->_vptr_PromiseNode);
        pDVar9 = (Disposer *)CONCAT44(extraout_var_00,iVar7);
        pPVar10 = extraout_RDX_01;
      }
      pPVar11 = local_58.ptr;
      PVar3.node.ptr = pPVar10;
      PVar3.node.disposer = pDVar9;
      if (local_58.ptr == (PromiseNode *)0x0) {
        return (Promise<void>)PVar3.node;
      }
      local_58.ptr = (PromiseNode *)0x0;
      pDVar9 = (Disposer *)CONCAT44(local_58.disposer._4_4_,local_58.disposer._0_4_);
    }
    iVar7 = (**pDVar9->_vptr_Disposer)
                      (pDVar9,pPVar11->_vptr_PromiseNode[-2] + (long)&pPVar11->_vptr_PromiseNode);
    OVar13.disposer._4_4_ = extraout_var_01;
    OVar13.disposer._0_4_ = iVar7;
    OVar13.ptr = extraout_RDX_02;
  }
  else {
    OVar13 = kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_78);
    (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_78.disposer;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_78.ptr;
  }
  return (PromiseBase)(PromiseBase)OVar13;
}

Assistant:

kj::Promise<void> messageLoop() {
    if (!connection.is<Connected>()) {
      return kj::READY_NOW;
    }

    if (callWordsInFlight > flowLimit) {
      auto paf = kj::newPromiseAndFulfiller<void>();
      flowWaiter = kj::mv(paf.fulfiller);
      return paf.promise.then([this]() {
        return messageLoop();
      });
    }

    return connection.get<Connected>()->receiveIncomingMessage().then(
        [this](kj::Maybe<kj::Own<IncomingRpcMessage>>&& message) {
      KJ_IF_MAYBE(m, message) {
        handleMessage(kj::mv(*m));
        return true;
      } else {
        disconnect(KJ_EXCEPTION(DISCONNECTED, "Peer disconnected."));
        return false;
      }
    }).then([this](bool keepGoing) {
      // No exceptions; continue loop.
      //
      // (We do this in a separate continuation to handle the case where exceptions are
      // disabled.)
      if (keepGoing) tasks.add(messageLoop());
    });
  }